

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O0

void __thiscall rsg::ValueStorage<1>::ValueStorage(ValueStorage<1> *this,VariableType *type)

{
  VariableType *type_local;
  ValueStorage<1> *this_local;
  
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_value);
  setStorage(this,type);
  return;
}

Assistant:

ValueStorage<Stride>::ValueStorage (const VariableType& type)
{
	setStorage(type);
}